

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

int Str_MuxTryOnce(Gia_Man_t *pNew,Str_Ntk_t *pNtk,Str_Mux_t *pTree,Str_Mux_t *pRoot,int Edge,
                  Vec_Int_t *vDelay,int fVerbose)

{
  Str_Mux_t *pTree_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint k;
  uint uVar5;
  ulong uVar6;
  uint i;
  int nLength;
  Str_Mux_t pBackup [3];
  int pPath [500];
  Vec_Int_t *pVVar7;
  uint local_90c;
  uint local_8ec;
  Str_Mux_t *local_8e8;
  Gia_Man_t *local_8e0;
  Vec_Int_t *local_8d8;
  ulong local_8d0;
  Str_Mux_t local_8c8 [3];
  int local_808 [502];
  
  local_8e8 = pTree;
  local_8d8 = vDelay;
  uVar1 = Str_MuxDelayEdge_rec(pRoot,Edge);
  local_8ec = 0;
  iVar2 = Str_MuxFindPathEdge_rec(pRoot,Edge,local_808,(int *)&local_8ec);
  uVar5 = local_8ec;
  if (iVar2 != 0) {
    uVar6 = (ulong)local_8ec;
    local_8e0 = pNew;
    if (fVerbose != 0) {
      printf("Trying node %d with path of length %d.\n",(ulong)(uint)pRoot->Id,uVar6);
    }
    if (0 < (int)uVar5) {
      iVar2 = uVar5 - 2;
      local_90c = 0xffffffff;
      uVar3 = 0;
      i = 0;
      uVar5 = uVar1;
      local_8d0 = uVar6;
      do {
        k = i + 2;
        if ((int)k < (int)uVar6) {
          uVar3 = uVar3 + iVar2;
          do {
            pTree_00 = local_8e8;
            Str_MuxChangeOnce(local_8e8,local_808,i,k,local_8c8,(Gia_Man_t *)0x0,(Vec_Int_t *)0x0);
            uVar4 = Str_MuxDelayEdge_rec(pRoot,Edge);
            Str_MuxChangeUndo(pTree_00,local_808,i,k,local_8c8);
            if (((int)uVar4 < (int)uVar5) || ((0 < (int)local_90c && (uVar5 == uVar4)))) {
              local_90c = k | i << 0x10;
              uVar5 = uVar4;
            }
            if (fVerbose != 0) {
              printf("%2d %2d -> %3d (%3d)\n",(ulong)i,(ulong)k,(ulong)uVar4);
            }
            k = k + 1;
            uVar6 = local_8d0;
          } while ((uint)local_8d0 != k);
        }
        i = i + 1;
        iVar2 = iVar2 + -1;
      } while (i != (uint)uVar6);
      if (local_90c != 0xffffffff) {
        pVVar7 = local_8d8;
        Str_MuxChangeOnce(local_8e8,local_808,(int)local_90c >> 0x10,local_90c & 0xffff,
                          (Str_Mux_t *)0x0,local_8e0,local_8d8);
        if (fVerbose == 0) {
          return 1;
        }
        printf("Node %6d (%3d %3d) : Checks = %d. Delay: %d -> %d.\n",(ulong)(uint)pRoot->Id,
               (ulong)(uint)((int)local_90c >> 0x10),(ulong)(local_90c & 0xffff),(ulong)uVar3,
               (ulong)uVar1,CONCAT44((int)((ulong)pVVar7 >> 0x20),uVar5));
        putchar(10);
        return 1;
      }
    }
    if (fVerbose != 0) {
      puts("Did not find!");
    }
  }
  return 0;
}

Assistant:

int Str_MuxTryOnce( Gia_Man_t * pNew, Str_Ntk_t * pNtk, Str_Mux_t * pTree, Str_Mux_t * pRoot, int Edge, Vec_Int_t * vDelay, int fVerbose )
{
    int pPath[500];
    Str_Mux_t pBackup[3];
    int Delay, DelayBest = Str_MuxDelayEdge_rec( pRoot, Edge ), DelayInit = DelayBest;
    int i, k, nLength = 0, ForkBest = -1, nChecks = 0;
    int RetValue = Str_MuxFindPathEdge_rec( pRoot, Edge, pPath, &nLength );
    if ( RetValue == 0 )
        return 0;
    if ( fVerbose )
        printf( "Trying node %d with path of length %d.\n", pRoot->Id, nLength );
    for ( i = 0; i < nLength; i++ )
    for ( k = i+2; k < nLength; k++ )
    {
        Str_MuxChangeOnce( pTree, pPath, i, k, pBackup, NULL, NULL );
        Delay = Str_MuxDelayEdge_rec( pRoot, Edge );
        Str_MuxChangeUndo( pTree, pPath, i, k, pBackup );
        if ( DelayBest > Delay || (ForkBest > 0 && DelayBest == Delay) )
            DelayBest = Delay, ForkBest = (i << 16) | k;
        if ( fVerbose )
            printf( "%2d %2d -> %3d (%3d)\n", i, k, Delay, DelayBest );
        nChecks++;
    }
    if ( ForkBest == -1 )
    {
        if ( fVerbose )
            printf( "Did not find!\n" );
        return 0;
    }
//    Str_MuxDelayPrint_rec( pRoot, Edge ); printf( "\n" );
    Str_MuxChangeOnce( pTree, pPath, ForkBest >> 16, ForkBest & 0xFFFF, NULL, pNew, vDelay );
//    Str_MuxDelayPrint_rec( pRoot, Edge ); printf( "\n" );
    if ( fVerbose )
        printf( "Node %6d (%3d %3d) : Checks = %d. Delay: %d -> %d.\n", 
            pRoot->Id, ForkBest >> 16, ForkBest & 0xFFFF, nChecks, DelayInit, DelayBest );
    if ( fVerbose )
        printf( "\n" );
    return 1;
}